

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O0

size_t nallocx_slow(size_t size,int flags)

{
  bool bVar1;
  SizeMap *pSVar2;
  Length LVar3;
  PageHeap *this;
  Length pages;
  bool ok;
  size_t sStack_38;
  uint32_t cl;
  size_t align;
  size_t sStack_28;
  int flags_local;
  size_t size_local;
  
  align._4_4_ = flags;
  sStack_28 = size;
  bVar1 = tcmalloc::Static::IsInited();
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    tcmalloc::ThreadCache::InitModule();
  }
  sStack_38 = 1L << ((byte)align._4_4_ & 0x3f);
  pages._3_1_ = size_class_with_alignment(sStack_28,sStack_38,(uint32_t *)((long)&pages + 4));
  if ((bool)pages._3_1_) {
    pSVar2 = tcmalloc::Static::sizemap();
    size_local = (size_t)pSVar2->class_to_size_[pages._4_4_];
  }
  else {
    LVar3 = tcmalloc::pages(sStack_28);
    this = tcmalloc::Static::pageheap();
    LVar3 = tcmalloc::PageHeap::RoundUpSize(this,LVar3);
    size_local = LVar3 << 0xd;
  }
  return size_local;
}

Assistant:

static ATTRIBUTE_NOINLINE size_t nallocx_slow(size_t size, int flags) {
  if (PREDICT_FALSE(!Static::IsInited())) ThreadCache::InitModule();

  size_t align = static_cast<size_t>(1ull << (flags & 0x3f));
  uint32_t cl;
  bool ok = size_class_with_alignment(size, align, &cl);
  if (ok) {
    return Static::sizemap()->ByteSizeForClass(cl);
  } else {
    Length pages = tcmalloc::pages(size);
    pages = Static::pageheap()->RoundUpSize(pages);
    return pages << kPageShift;
  }
}